

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_system.c
# Opt level: O3

void nes_system_read_memory
               (nes_system *system,nes_memory_type memory_type,uint16_t address,void *buffer,
               size_t buffer_size)

{
  code *pcVar1;
  undefined1 uVar2;
  ushort uVar3;
  ulong uVar4;
  
  if ((memory_type < (NES_MEMORY_TYPE_OAM|NES_MEMORY_TYPE_PPU)) && (buffer_size != 0)) {
    pcVar1 = (code *)(&PTR_nes_system_read_cpu_byte_0010cdb8)[memory_type];
    uVar3 = 1;
    uVar4 = 0;
    do {
      uVar2 = (*pcVar1)(system,address + uVar3 + -1);
      *(undefined1 *)((long)buffer + uVar4) = uVar2;
      uVar4 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar4 < buffer_size);
  }
  return;
}

Assistant:

void nes_system_read_memory(nes_system* system, nes_memory_type memory_type, uint16_t address, void* buffer, size_t buffer_size)
{
    uint8_t (*read_byte)(nes_system*, uint16_t) = 0;
    switch (memory_type)
    {
        case NES_MEMORY_TYPE_CPU : read_byte = nes_system_read_cpu_byte; break;
        case NES_MEMORY_TYPE_PPU : read_byte = nes_system_read_ppu_byte; break;
        case NES_MEMORY_TYPE_OAM : read_byte = nes_system_read_oam_byte; break;
        default: break;
    }

    if (!read_byte)
        return;

    for (uint16_t i = 0; i < buffer_size; ++i)
        *((uint8_t*)buffer + i) = read_byte(system, address + i);
}